

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData *
cfd::core::CryptoUtil::ConvertSignatureFromDer
          (ByteData *__return_storage_ptr__,ByteData *der_data,SigHashType *sighash_type)

{
  size_type sVar1;
  CfdException *pCVar2;
  reference pvVar3;
  uchar *bytes;
  uchar *bytes_out;
  size_type len;
  allocator local_e1;
  string local_e0;
  CfdSourceLocation local_c0;
  int local_a8;
  allocator<unsigned_char> local_a1;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  undefined1 local_80 [5];
  uint8_t sighash_byte;
  CfdSourceLocation local_50;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> der_sig;
  SigHashType *sighash_type_local;
  ByteData *der_data_local;
  
  der_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &sighash_type->kSigHashForkId;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,der_data);
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  if (sVar1 == 0) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x349;
    local_50.funcname = "ConvertSignatureFromDer";
    logger::warn<>(&local_50,"Empty signature.");
    output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)local_80,"der decode error.",
               (allocator *)
               ((long)&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_80);
    output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  if (sVar1 < 0x4a) {
    sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    pvVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,sVar1 - 1)
    ;
    output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_1_ = *pvVar3;
    sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,sVar1 - 1);
    if (der_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      SigHashType::SetFromSigHashFlag
                ((SigHashType *)
                 der_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                 output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._5_1_);
    }
  }
  ::std::allocator<unsigned_char>::allocator(&local_a1);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,0x40,&local_a1);
  ::std::allocator<unsigned_char>::~allocator(&local_a1);
  bytes = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  local_a8 = wally_ec_sig_from_der(bytes,sVar1,bytes_out,len);
  if (local_a8 == 0) {
    ByteData::ByteData(__return_storage_ptr__,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    return __return_storage_ptr__;
  }
  local_c0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
               ,0x2f);
  local_c0.filename = local_c0.filename + 1;
  local_c0.line = 0x35a;
  local_c0.funcname = "ConvertSignatureFromDer";
  logger::warn<int&>(&local_c0,"wally_ec_sig_from_der NG[{}].",&local_a8);
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_e0,"der decode error.",&local_e1);
  CfdException::CfdException(pCVar2,kCfdIllegalStateError,&local_e0);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData CryptoUtil::ConvertSignatureFromDer(
    const ByteData &der_data, SigHashType *sighash_type) {
  std::vector<uint8_t> der_sig = der_data.GetBytes();

  if (der_sig.size() == 0) {
    warn(CFD_LOG_SOURCE, "Empty signature.");
    throw CfdException(kCfdIllegalStateError, "der decode error.");
  }

  if (der_sig.size() <= (EC_SIGNATURE_DER_MAX_LEN + 1)) {
    uint8_t sighash_byte = der_sig[der_sig.size() - 1];
    der_sig.resize(der_sig.size() - 1);

    if (sighash_type != nullptr) {
      sighash_type->SetFromSigHashFlag(sighash_byte);
    }
  }

  std::vector<uint8_t> output(EC_SIGNATURE_LEN);
  int ret = wally_ec_sig_from_der(
      der_sig.data(), der_sig.size(), output.data(), output.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_ec_sig_from_der NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "der decode error.");
  }
  return ByteData(output);
}